

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImDrawChannel_resize(ImVector_ImDrawChannel *self,int new_size)

{
  int new_size_local;
  ImVector_ImDrawChannel *self_local;
  
  ImVector<ImDrawChannel>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawChannel_resize(ImVector_ImDrawChannel* self,int new_size)
{
    return self->resize(new_size);
}